

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

void __thiscall
pbrt::syntactic::BasicLexer<pbrt::syntactic::MappedFile>::~BasicLexer
          (BasicLexer<pbrt::syntactic::MappedFile> *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->buffer).source.
              super___shared_ptr<pbrt::syntactic::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)this);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE BasicLexer {

      //! constructor
      BasicLexer(typename DataSource::SP ds) : buffer(ds) {}

      Token next();
      
    private:
      /*! utility class to assemble tokens. Provides a stream interface
        but is generally faster than e.g. std::stringstream */
      struct CharBuffer {
        CharBuffer(std::size_t reserved = 0)
          : data_(reserved)
        {
        }

        void operator<<(char c) { data_.push_back(c); }
        void clear() { data_.clear(); }
        std::string str() { return std::string(data_.data(), data_.size()); }
      private:
        std::vector<char> data_;
      };

      CharBuffer(ss);

      ReadBuffer<typename DataSource::SP> buffer;
    }